

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

void __thiscall
soul::HTMLGenerator::printLibrary(HTMLGenerator *this,HTMLElement *parent,File *library)

{
  bool bVar1;
  HTMLElement *pHVar2;
  ulong uVar3;
  vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_> *this_00;
  reference m_00;
  undefined1 in_R8B;
  undefined1 auVar4 [16];
  string_view text;
  Module *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string_view local_a0;
  string_view local_90;
  allocator<char> local_69;
  string local_68;
  string_view local_48;
  string_view local_38;
  HTMLElement *local_28;
  HTMLElement *libraryDiv;
  File *library_local;
  HTMLElement *parent_local;
  HTMLGenerator *this_local;
  
  libraryDiv = (HTMLElement *)library;
  library_local = (File *)parent;
  parent_local = (HTMLElement *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"library");
  pHVar2 = choc::html::HTMLElement::addDiv(parent,local_38);
  local_48 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)
                        &(libraryDiv->children).
                         super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  pHVar2 = choc::html::HTMLElement::setID(pHVar2,local_48);
  local_28 = pHVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"h1",&local_69);
  pHVar2 = choc::html::HTMLElement::addChild(pHVar2,&local_68);
  local_90 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)
                        &libraryDiv[1].properties.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  choc::html::HTMLElement::addContent(pHVar2,local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  uVar3 = std::__cxx11::string::empty();
  pHVar2 = local_28;
  if ((uVar3 & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"summary");
    pHVar2 = choc::html::HTMLElement::addDiv(pHVar2,local_a0);
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)
                        &libraryDiv[1].children.
                         super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    text._M_len = auVar4._8_8_;
    text._M_str = (char *)0x0;
    choc::text::splitIntoLines_abi_cxx11_(&local_b8,auVar4._0_8_,text,(bool)in_R8B);
    addMarkdownAsHTML(pHVar2,&local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
  }
  this_00 = (vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_> *
            )((long)&libraryDiv[2].name.field_2 + 8);
  __end2 = std::
           vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>::
           begin(this_00);
  m = (Module *)
      std::vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>::
      end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::SourceCodeModel::Module_*,_std::vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>_>
                                *)&m);
    if (!bVar1) break;
    m_00 = __gnu_cxx::
           __normal_iterator<const_soul::SourceCodeModel::Module_*,_std::vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>_>
           ::operator*(&__end2);
    printModule(this,local_28,m_00);
    __gnu_cxx::
    __normal_iterator<const_soul::SourceCodeModel::Module_*,_std::vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void printLibrary (choc::html::HTMLElement& parent, const SourceCodeModel::File& library)
    {
        auto& libraryDiv = parent.addDiv ("library").setID (library.UID);

        libraryDiv.addChild ("h1").addContent (library.title);

        if (! library.summary.empty())
            addMarkdownAsHTML (libraryDiv.addDiv ("summary"),
                               choc::text::splitIntoLines (library.summary, false));

        for (auto& m : library.modules)
            printModule (libraryDiv, m);
    }